

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadrilateral.h
# Opt level: O0

Quadrilateral<ZXing::PointT<double>_> *
ZXing::RotatedCorners<ZXing::PointT<double>>
          (Quadrilateral<ZXing::PointT<double>_> *q,int n,bool mirror)

{
  const_iterator __middle;
  const_iterator __result;
  reference __a;
  reference __b;
  byte in_CL;
  int in_EDX;
  PointT<double> *in_RDI;
  Quadrilateral<ZXing::PointT<double>_> *res;
  size_type in_stack_ffffffffffffffb8;
  PointT<double> *__last;
  const_iterator __first;
  
  __last = in_RDI;
  Quadrilateral<ZXing::PointT<double>_>::Quadrilateral
            ((Quadrilateral<ZXing::PointT<double>_> *)0x25d097);
  __middle = std::array<ZXing::PointT<double>,_4UL>::begin
                       ((array<ZXing::PointT<double>,_4UL> *)0x25d0a1);
  __result = std::array<ZXing::PointT<double>,_4UL>::begin
                       ((array<ZXing::PointT<double>,_4UL> *)0x25d0b0);
  __first = __result + (in_EDX + 4) % 4;
  std::array<ZXing::PointT<double>,_4UL>::end((array<ZXing::PointT<double>,_4UL> *)0x25d0e2);
  std::array<ZXing::PointT<double>,_4UL>::begin((array<ZXing::PointT<double>,_4UL> *)0x25d0f1);
  std::rotate_copy<ZXing::PointT<double>const*,ZXing::PointT<double>*>
            (__first,__middle,__last,__result);
  if ((in_CL & 1) != 0) {
    __a = std::array<ZXing::PointT<double>,_4UL>::operator[]
                    ((array<ZXing::PointT<double>,_4UL> *)in_RDI,in_stack_ffffffffffffffb8);
    __b = std::array<ZXing::PointT<double>,_4UL>::operator[]
                    ((array<ZXing::PointT<double>,_4UL> *)in_RDI,(size_type)__a);
    std::swap<ZXing::PointT<double>>(__a,__b);
  }
  return (Quadrilateral<ZXing::PointT<double>_> *)in_RDI;
}

Assistant:

Quadrilateral<PointT> RotatedCorners(const Quadrilateral<PointT>& q, int n = 1, bool mirror = false)
{
	Quadrilateral<PointT> res;
	std::rotate_copy(q.begin(), q.begin() + ((n + 4) % 4), q.end(), res.begin());
	if (mirror)
		std::swap(res[1], res[3]);
	return res;
}